

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O2

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>_>
         *this)

{
  CATCH2_INTERNAL_TEMPLATE_TEST_135<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  obj;
  
  anon_unknown.dwarf_965823::Constructable::reset();
  obj.
  super_DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  .theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.data_ =
       (pointer)obj.
                super_DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
                .theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.firstElement;
  obj.
  super_DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  .theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.len = 0;
  obj.
  super_DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  .theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.cap = 2;
  obj.
  super_DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  .otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.data_ =
       (pointer)obj.
                super_DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
                .otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.
                firstElement;
  obj.
  super_DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  .otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.len = 0;
  obj.
  super_DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  .otherVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.cap = 2;
  (*(code *)this->m_testAsMethod)
            (obj.
             super_DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
             .theVector.super_SmallVectorBase<(anonymous_namespace)::Constructable>.firstElement +
             *(long *)&this->field_0x10 + -0x18);
  anon_unknown.dwarf_965823::
  DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
  ::~DualSmallVectorsTest
            (&obj.
              super_DualSmallVectorsTest<std::pair<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>,_slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
            );
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }